

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

void __thiscall glslang::HlslParseContext::fixBuiltInIoType(HlslParseContext *this,TType *type)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  TBasicType t;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  TPoolAllocator *this_00;
  TArraySizes *this_01;
  long lVar6;
  undefined8 *puVar7;
  TQualifier *pTVar8;
  byte bVar9;
  uint uVar10;
  byte bVar11;
  TType newType;
  TType local_c8;
  
  bVar11 = 0;
  iVar2 = (*type->_vptr_TType[10])(type);
  uVar3 = *(uint *)(CONCAT44(extraout_var,iVar2) + 8) >> 7 & 0x1ff;
  if (uVar3 < 0x38) {
    if (((uVar3 != 3) && (uVar3 != 4)) && (uVar3 != 5)) {
LAB_0040ae5b:
      iVar2 = (*type->_vptr_TType[0xb])(type);
      if (1 < (*(uint *)(CONCAT44(extraout_var_00,iVar2) + 8) >> 7 & 0x1ff) - 0x21) {
        return;
      }
      iVar2 = (*type->_vptr_TType[10])(type);
      uVar10 = (uint)*(undefined8 *)(CONCAT44(extraout_var_01,iVar2) + 0x1c) & 0xfff;
      iVar2 = (*type->_vptr_TType[10])(type);
      uVar3 = *(uint *)(CONCAT44(extraout_var_02,iVar2) + 8);
      iVar2 = (*type->_vptr_TType[10])(type);
      uVar5 = (uint)*(undefined8 *)(CONCAT44(extraout_var_03,iVar2) + 8) & 0x7f;
      iVar2 = (*type->_vptr_TType[0xc])(type);
      if ((uVar3 & 0xff80) == 0x1080) {
        if (uVar5 == 3) {
          (this->clipSemanticNSizeIn)._M_elems[uVar10] = iVar2;
          return;
        }
        (this->clipSemanticNSizeOut)._M_elems[uVar10] = iVar2;
        return;
      }
      if (uVar5 == 3) {
        (this->cullSemanticNSizeIn)._M_elems[uVar10] = iVar2;
        return;
      }
      (this->cullSemanticNSizeOut)._M_elems[uVar10] = iVar2;
      return;
    }
LAB_0040ae49:
    bVar9 = 0;
    iVar2 = 3;
    bVar1 = true;
    uVar3 = 0;
  }
  else {
    if (uVar3 < 0x3b) {
      bVar9 = 1;
      if (uVar3 == 0x38) {
        uVar3 = 4;
      }
      else {
        if (uVar3 != 0x39) goto LAB_0040ae5b;
        uVar3 = 2;
      }
    }
    else {
      if (uVar3 == 0x3b) goto LAB_0040ae49;
      if (uVar3 != 0x47) goto LAB_0040ae5b;
      iVar2 = (*type->_vptr_TType[0x1d])(type);
      bVar9 = (byte)iVar2 ^ 1;
      uVar3 = (uint)bVar9;
    }
    bVar1 = false;
    iVar2 = 0;
  }
  if (bVar1) {
    t = (*type->_vptr_TType[7])(type);
    iVar4 = (*type->_vptr_TType[10])(type);
    TType::TType(&local_c8,t,*(TStorageQualifier *)(CONCAT44(extraout_var_04,iVar4) + 8) & 0x7f,
                 iVar2,0,0,false);
    iVar2 = (*type->_vptr_TType[10])(type);
    puVar7 = (undefined8 *)CONCAT44(extraout_var_05,iVar2);
    pTVar8 = &local_c8.qualifier;
    for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
      pTVar8->semanticName = (char *)*puVar7;
      puVar7 = puVar7 + (ulong)bVar11 * -2 + 1;
      pTVar8 = (TQualifier *)((long)pTVar8 + ((ulong)bVar11 * -2 + 1) * 8);
    }
    TType::shallowCopy(type,&local_c8);
  }
  if ((bVar9 != 0) &&
     ((iVar2 = (*type->_vptr_TType[0x1d])(type), (char)iVar2 == '\0' ||
      (uVar5 = (*type->_vptr_TType[0xf])(type), uVar5 != uVar3)))) {
    this_00 = GetThreadPoolAllocator();
    this_01 = (TArraySizes *)TPoolAllocator::allocate(this_00,0x18);
    (this_01->sizes)._vptr_TSmallArrayVector = (_func_int **)&PTR__TSmallArrayVector_00b092a0;
    (this_01->sizes).sizes = (TVector<glslang::TArraySize> *)0x0;
    this_01->implicitArraySize = 0;
    this_01->implicitlySized = true;
    this_01->variablyIndexed = false;
    TSmallArrayVector::push_back((TSmallArrayVector *)this_01,uVar3,(TIntermTyped *)0x0);
    type->arraySizes = this_01;
  }
  return;
}

Assistant:

void HlslParseContext::fixBuiltInIoType(TType& type)
{
    int requiredArraySize = 0;
    int requiredVectorSize = 0;

    switch (type.getQualifier().builtIn) {
    case EbvTessLevelOuter: requiredArraySize = 4; break;
    case EbvTessLevelInner: requiredArraySize = 2; break;

    case EbvSampleMask:
        {
            // Promote scalar to array of size 1.  Leave existing arrays alone.
            if (!type.isArray())
                requiredArraySize = 1;
            break;
        }

    case EbvWorkGroupId:        requiredVectorSize = 3; break;
    case EbvGlobalInvocationId: requiredVectorSize = 3; break;
    case EbvLocalInvocationId:  requiredVectorSize = 3; break;
    case EbvTessCoord:          requiredVectorSize = 3; break;

    default:
        if (isClipOrCullDistance(type)) {
            const int loc = type.getQualifier().layoutLocation;

            if (type.getQualifier().builtIn == EbvClipDistance) {
                if (type.getQualifier().storage == EvqVaryingIn)
                    clipSemanticNSizeIn[loc] = type.getVectorSize();
                else
                    clipSemanticNSizeOut[loc] = type.getVectorSize();
            } else {
                if (type.getQualifier().storage == EvqVaryingIn)
                    cullSemanticNSizeIn[loc] = type.getVectorSize();
                else
                    cullSemanticNSizeOut[loc] = type.getVectorSize();
            }
        }

        return;
    }

    // Alter or set vector size as needed.
    if (requiredVectorSize > 0) {
        TType newType(type.getBasicType(), type.getQualifier().storage, requiredVectorSize);
        newType.getQualifier() = type.getQualifier();

        type.shallowCopy(newType);
    }

    // Alter or set array size as needed.
    if (requiredArraySize > 0) {
        if (!type.isArray() || type.getOuterArraySize() != requiredArraySize) {
            TArraySizes* arraySizes = new TArraySizes;
            arraySizes->addInnerSize(requiredArraySize);
            type.transferArraySizes(arraySizes);
        }
    }
}